

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::ChaiScript_Parser::
Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
process_hex(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  size_t *in_RDI;
  longlong val;
  string *in_stack_fffffffffffffff0;
  
  std::__cxx11::stoll(in_stack_fffffffffffffff0,in_RDI,0);
  std::__cxx11::string::push_back((char)*in_RDI);
  std::__cxx11::string::clear();
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

void process_hex()
        {
          auto val = stoll(hex_matches, 0, 16);
          match.push_back(char_type(val));
          hex_matches.clear();
          is_escaped = false;
          is_hex = false;
        }